

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O1

void multi_kv_open_test(void)

{
  fdb_status fVar1;
  size_t keylen;
  size_t metalen;
  size_t bodylen;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  fdb_kvs_config *unaff_R12;
  uint8_t opt;
  int iVar6;
  int i;
  long lVar7;
  size_t chunksize;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  char kvname [8];
  timeval __test_begin;
  fdb_kvs_handle *pfStack_678;
  fdb_file_handle *pfStack_670;
  fdb_kvs_handle *pfStack_668;
  fdb_kvs_handle *pfStack_660;
  fdb_doc *pfStack_658;
  fdb_kvs_handle *pfStack_650;
  fdb_kvs_handle *pfStack_648;
  fdb_doc *apfStack_640 [11];
  timeval tStack_5e8;
  fdb_kvs_config fStack_5d8;
  char acStack_5c0 [256];
  char acStack_4c0 [256];
  char acStack_3c0 [256];
  fdb_config fStack_2c0;
  fdb_config *pfStack_1c8;
  fdb_kvs_config *pfStack_1c0;
  fdb_file_handle *local_198;
  undefined1 local_190 [40];
  timeval local_168;
  pthread_t apStack_158 [7];
  fdb_config local_120;
  
  gettimeofday(&local_168,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  multi_kv_test* > errorlog.txt");
  pcVar2 = (char *)&local_120;
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&local_198,"multi_kv_test2",(fdb_config *)pcVar2);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    lVar7 = 0;
    do {
      pthread_create((pthread_t *)((long)apStack_158 + lVar7),(pthread_attr_t *)0x0,_opening_thread,
                     (void *)0x0);
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x38);
    pcVar2 = "kv_%d";
    unaff_R12 = (fdb_kvs_config *)(local_190 + 0x10);
    uVar3 = 0;
    do {
      sprintf(local_190 + 8,"kv_%d",uVar3);
      fVar1 = fdb_kvs_open(local_198,(fdb_kvs_handle **)local_190,local_190 + 8,unaff_R12);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        multi_kv_open_test();
        goto LAB_0011713f;
      }
      uVar4 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar4;
    } while (uVar4 != 0x100);
    lVar7 = 0;
    pcVar2 = local_190;
    do {
      pthread_join(apStack_158[lVar7],(void **)pcVar2);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
    fVar1 = fdb_close(local_198);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00117144;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      memleak_end();
      pcVar2 = "%s PASSED\n";
      if (multi_kv_open_test()::__test_pass != '\0') {
        pcVar2 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar2,"multi KV creation with parallel open");
      return;
    }
  }
  else {
LAB_0011713f:
    multi_kv_open_test();
LAB_00117144:
    multi_kv_open_test();
  }
  multi_kv_open_test();
  pfStack_1c8 = (fdb_config *)pcVar2;
  pfStack_1c0 = unaff_R12;
  gettimeofday(&tStack_5e8,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  multi_kv_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_2c0.buffercache_size = 0;
  fStack_2c0.seqtree_opt = '\x01';
  fStack_2c0.wal_threshold = 8;
  fStack_2c0.flags = 1;
  fStack_2c0.purging_interval = 0;
  fStack_2c0.compaction_threshold = '\0';
  fStack_2c0.wal_flush_before_commit = true;
  fdb_get_default_kvs_config();
  fdb_open(&pfStack_670,"multi_kv_test1",&fStack_2c0);
  fdb_kvs_open(pfStack_670,&pfStack_660,"db1",&fStack_5d8);
  fdb_kvs_open(pfStack_670,&pfStack_678,"db2",&fStack_5d8);
  fdb_kvs_open(pfStack_670,&pfStack_648,"db3",&fStack_5d8);
  fdb_kvs_open(pfStack_670,&pfStack_650,"db4",&fStack_5d8);
  fdb_kvs_open(pfStack_670,&pfStack_668,"db5",&fStack_5d8);
  lVar7 = 0;
  uVar3 = 0;
  do {
    sprintf(acStack_3c0,"key%d",uVar3 & 0xffffffff);
    sprintf(acStack_4c0,"meta%d",uVar3 & 0xffffffff);
    sprintf(acStack_5c0,"body%d",uVar3 & 0xffffffff);
    keylen = strlen(acStack_3c0);
    metalen = strlen(acStack_4c0);
    bodylen = strlen(acStack_5c0);
    fdb_doc_create((fdb_doc **)((long)apfStack_640 + lVar7),acStack_3c0,keylen,acStack_4c0,metalen,
                   acStack_5c0,bodylen);
    fdb_set(pfStack_660,apfStack_640[uVar3]);
    fdb_set(pfStack_678,apfStack_640[uVar3]);
    fdb_set(pfStack_648,apfStack_640[uVar3]);
    fdb_set(pfStack_650,apfStack_640[uVar3]);
    fdb_set(pfStack_668,apfStack_640[uVar3]);
    uVar3 = uVar3 + 1;
    lVar7 = lVar7 + 8;
  } while (uVar3 != 10);
  fdb_kvs_close(pfStack_648);
  fdb_kvs_close(pfStack_650);
  lVar7 = 0;
  do {
    fdb_set(pfStack_660,apfStack_640[lVar7]);
    fdb_set(pfStack_678,apfStack_640[lVar7]);
    fdb_set(pfStack_668,apfStack_640[lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  fdb_kvs_close(pfStack_660);
  fVar1 = fdb_kvs_remove(pfStack_670,"db1");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001174ec;
  fVar1 = fdb_commit(pfStack_670,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001174f1;
  fdb_kvs_close(pfStack_668);
  fVar1 = fdb_kvs_remove(pfStack_670,"db5");
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001174f6;
  lVar7 = 0;
  do {
    fdb_doc_create(&pfStack_658,apfStack_640[lVar7]->key,apfStack_640[lVar7]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    fVar1 = fdb_get(pfStack_678,pfStack_658);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      multi_kv_close_test();
      goto LAB_001174e7;
    }
    fdb_doc_free(pfStack_658);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  fVar1 = fdb_kvs_close(pfStack_678);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001174fb;
  lVar7 = 0;
  do {
    fVar1 = fdb_doc_free(apfStack_640[lVar7]);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001174e7;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 10);
  fVar1 = fdb_close(pfStack_670);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      memleak_end();
      pcVar2 = "%s PASSED\n";
      if (multi_kv_close_test()::__test_pass != '\0') {
        pcVar2 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar2,"multi KV close");
      return;
    }
    goto LAB_00117505;
  }
  goto LAB_00117500;
LAB_001174e7:
  multi_kv_close_test();
LAB_001174ec:
  multi_kv_close_test();
LAB_001174f1:
  multi_kv_close_test();
LAB_001174f6:
  multi_kv_close_test();
LAB_001174fb:
  multi_kv_close_test();
LAB_00117500:
  multi_kv_close_test();
LAB_00117505:
  multi_kv_close_test();
  multi_kv_open_test();
  iVar5 = 0;
  do {
    chunksize = (ulong)(iVar5 != 1) * 0x10 + 0x10;
    if (iVar5 == 0) {
      chunksize = 8;
    }
    printf("Chunk size: %d bytes\n",chunksize);
    iVar6 = 0;
    do {
      opt = (uint8_t)iVar6;
      multi_kv_test(opt,chunksize);
      multi_kv_iterator_key_test(opt,chunksize);
      multi_kv_iterator_seq_test(opt,chunksize);
      multi_kv_txn_test(opt,chunksize);
      multi_kv_snapshot_test(opt,chunksize);
      multi_kv_rollback_test(opt,chunksize);
      iVar6 = iVar6 + 1;
    } while (iVar6 == 1);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  multi_kv_custom_cmp_test();
  multi_kv_fdb_open_custom_cmp_test();
  multi_kv_use_existing_mode_test();
  multi_kv_close_test();
  return;
}

Assistant:

void multi_kv_open_test()
{
    TEST_INIT();
    memleak_start();

    int n = 256;
    int nthreads = 7;
    thread_t *tid = alca(thread_t, nthreads);
    fdb_file_handle *dbfile;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;

    // remove previous multi_kv_test files
    int r = system(SHELL_DEL" multi_kv_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();

    // open db
    status = fdb_open(&dbfile, "multi_kv_test2", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (int i = 0; i < nthreads; ++i) {
        thread_create(&tid[i], _opening_thread, NULL);
    }
    for (int i = 0; i < n; ++i) {
        fdb_kvs_handle *db;
        char kvname[8];
        sprintf(kvname, "kv_%d", i);
        status = fdb_kvs_open(dbfile, &db, kvname, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    for (int i = 0; i < nthreads; ++i) {
        void *thread_ret;
        thread_join(tid[i], &thread_ret);
    }

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT("multi KV creation with parallel open");
}